

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::Reflection::SwapOneofField<false>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  int key;
  LogMessage *pLVar1;
  FieldDescriptor *pFVar2;
  double *pdVar3;
  uint *puVar4;
  float *pfVar5;
  bool *pbVar6;
  FieldDescriptor *pFVar7;
  Message *sub_message;
  int *piVar8;
  byte bVar9;
  LocalVarWrapper temp;
  Reflection *local_190;
  Message *local_188;
  FieldDescriptor *local_180;
  Reflection *local_178;
  Message *local_170;
  FieldDescriptor *local_168;
  FieldDescriptor *local_160;
  undefined1 local_158 [60];
  int local_11c;
  Message *local_118;
  Message *local_110;
  string local_108;
  FieldDescriptor *local_e8;
  LogMessage *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar9 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar9 = 0;
  }
  local_118 = rhs;
  if (bVar9 != 0) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x36f);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)local_158,pLVar1);
    if (bVar9 != 0) {
      internal::LogMessage::~LogMessage(&local_d8);
    }
  }
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar9 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar9 = 0;
  }
  if (bVar9 != 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)local_158,pLVar1);
    if (bVar9 != 0) {
      internal::LogMessage::~LogMessage(&local_a0);
    }
  }
  if (*(int *)(oneof_descriptor + 4) == 1) {
    bVar9 = (*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) >> 1;
  }
  else {
    bVar9 = 0;
  }
  local_11c = *(int *)((long)&(lhs->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                                 *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30
                                                          )) >> 3) * 0x33333334 +
                                   (this->schema_).oneof_case_offset_));
  if (bVar9 != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
               ,0x5b7);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)local_158,pLVar1);
    if (bVar9 != 0) {
      internal::LogMessage::~LogMessage(&local_68);
    }
  }
  key = *(int *)((long)&(local_118->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   3) * 0x33333334 + (this->schema_).oneof_case_offset_));
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  if (local_11c == 0) {
    pFVar2 = (FieldDescriptor *)0x0;
    goto LAB_003a6652;
  }
  pFVar2 = Descriptor::FindFieldByNumber(this->descriptor_,local_11c);
  local_178 = this;
  local_170 = lhs;
  local_168 = pFVar2;
  if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
    local_158._0_8_ = FieldDescriptor::TypeOnceInit;
    local_160 = pFVar2;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)local_158,
               &local_160);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar2[2] * 4)) {
  case 1:
    puVar4 = (uint *)GetRaw<int>(local_178,local_170,local_168);
    goto LAB_003a650a;
  case 2:
    pdVar3 = (double *)GetRaw<long>(local_178,local_170,local_168);
    goto LAB_003a652c;
  case 3:
    puVar4 = GetRaw<unsigned_int>(local_178,local_170,local_168);
    goto LAB_003a650a;
  case 4:
    pdVar3 = (double *)GetRaw<unsigned_long>(local_178,local_170,local_168);
LAB_003a652c:
    local_110 = (Message *)*pdVar3;
    break;
  case 5:
    pdVar3 = GetRaw<double>(local_178,local_170,local_168);
    local_110 = (Message *)*pdVar3;
    break;
  case 6:
    pfVar5 = GetRaw<float>(local_178,local_170,local_168);
    local_110 = (Message *)CONCAT44(local_110._4_4_,*pfVar5);
    break;
  case 7:
    pbVar6 = GetRaw<bool>(local_178,local_170,local_168);
    local_110 = (Message *)CONCAT71(local_110._1_7_,*pbVar6);
    break;
  case 8:
    puVar4 = (uint *)GetRaw<int>(local_178,local_170,local_168);
LAB_003a650a:
    local_110 = (Message *)CONCAT44(local_110._4_4_,*puVar4);
    break;
  case 9:
    GetString_abi_cxx11_((string *)local_158,local_178,local_170,local_168);
    std::__cxx11::string::_M_assign((string *)&local_108);
    if ((Message *)local_158._0_8_ != (Message *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_);
    }
    break;
  case 10:
    local_110 = ReleaseMessage(local_178,local_170,local_168,(MessageFactory *)0x0);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_158,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x1bf);
    pLVar1 = internal::LogMessage::operator<<((LogMessage *)local_158,"unimplemented type: ");
    if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
      local_160 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_e8 = pFVar2;
      local_e0 = pLVar1;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_160,
                 &local_e8);
      pLVar1 = local_e0;
    }
    pLVar1 = internal::LogMessage::operator<<
                       (pLVar1,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                       (ulong)(byte)pFVar2[2] * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)local_158);
  }
LAB_003a6652:
  if (key == 0) {
    ClearOneof(this,lhs,oneof_descriptor);
  }
  else {
    pFVar7 = Descriptor::FindFieldByNumber(this->descriptor_,key);
    local_188 = local_118;
    local_190 = this;
    local_180 = pFVar7;
    local_178 = this;
    local_170 = lhs;
    local_168 = pFVar7;
    if (*(once_flag **)(pFVar7 + 0x18) != (once_flag *)0x0) {
      local_158._0_8_ = FieldDescriptor::TypeOnceInit;
      local_160 = pFVar7;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar7 + 0x18),(_func_void_FieldDescriptor_ptr **)local_158,
                 &local_160);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar7[2] * 4)) {
    case 1:
      piVar8 = GetRaw<int>(local_190,local_188,local_180);
      local_158._0_4_ = *piVar8;
      SetField<int>(local_178,local_170,local_168,(int *)local_158);
      break;
    case 2:
      pdVar3 = (double *)GetRaw<long>(local_190,local_188,local_180);
      local_158._0_8_ = *pdVar3;
      SetField<long>(local_178,local_170,local_168,(long *)local_158);
      break;
    case 3:
      puVar4 = GetRaw<unsigned_int>(local_190,local_188,local_180);
      local_158._0_4_ = *puVar4;
      SetField<unsigned_int>(local_178,local_170,local_168,(uint *)local_158);
      break;
    case 4:
      pdVar3 = (double *)GetRaw<unsigned_long>(local_190,local_188,local_180);
      local_158._0_8_ = *pdVar3;
      SetField<unsigned_long>(local_178,local_170,local_168,(unsigned_long *)local_158);
      break;
    case 5:
      pdVar3 = GetRaw<double>(local_190,local_188,local_180);
      local_158._0_8_ = *pdVar3;
      SetField<double>(local_178,local_170,local_168,(double *)local_158);
      break;
    case 6:
      pfVar5 = GetRaw<float>(local_190,local_188,local_180);
      local_158._0_4_ = *pfVar5;
      SetField<float>(local_178,local_170,local_168,(float *)local_158);
      break;
    case 7:
      pbVar6 = GetRaw<bool>(local_190,local_188,local_180);
      local_158[0] = *pbVar6;
      SetField<bool>(local_178,local_170,local_168,(bool *)local_158);
      break;
    case 8:
      piVar8 = GetRaw<int>(local_190,local_188,local_180);
      local_158._0_4_ = *piVar8;
      SetField<int>(local_178,local_170,local_168,(int *)local_158);
      break;
    case 9:
      GetString_abi_cxx11_((string *)local_158,local_190,local_188,local_180);
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_178,(string *)local_158);
      if ((Message *)local_158._0_8_ != (Message *)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_);
      }
      break;
    case 10:
      sub_message = ReleaseMessage(local_190,local_188,local_180,(MessageFactory *)0x0);
      SetAllocatedMessage(local_178,local_170,sub_message,local_168);
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_158,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar1 = internal::LogMessage::operator<<((LogMessage *)local_158,"unimplemented type: ");
      if (*(once_flag **)(pFVar7 + 0x18) != (once_flag *)0x0) {
        local_160 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_e8 = pFVar7;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar7 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_160,
                   &local_e8);
      }
      pLVar1 = internal::LogMessage::operator<<
                         (pLVar1,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)pFVar7[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar1);
      internal::LogMessage::~LogMessage((LogMessage *)local_158);
    }
  }
  if (local_11c == 0) {
    ClearOneof(this,local_118,oneof_descriptor);
  }
  else {
    local_188 = local_118;
    local_190 = this;
    local_180 = pFVar2;
    if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
      local_158._0_8_ = FieldDescriptor::TypeOnceInit;
      local_160 = pFVar2;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)local_158,
                 &local_160);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pFVar2[2] * 4)) {
    case 1:
      local_158._0_4_ = local_110._0_4_;
      SetField<int>(local_190,local_188,local_180,(int *)local_158);
      break;
    case 2:
      local_158._0_8_ = local_110;
      SetField<long>(local_190,local_188,local_180,(long *)local_158);
      break;
    case 3:
      local_158._0_4_ = local_110._0_4_;
      SetField<unsigned_int>(local_190,local_188,local_180,(uint *)local_158);
      break;
    case 4:
      local_158._0_8_ = local_110;
      SetField<unsigned_long>(local_190,local_188,local_180,(unsigned_long *)local_158);
      break;
    case 5:
      local_158._0_8_ = local_110;
      SetField<double>(local_190,local_188,local_180,(double *)local_158);
      break;
    case 6:
      local_158._0_4_ = local_110._0_4_;
      SetField<float>(local_190,local_188,local_180,(float *)local_158);
      break;
    case 7:
      local_158[0] = local_110._0_1_;
      SetField<bool>(local_190,local_188,local_180,(bool *)local_158);
      break;
    case 8:
      local_158._0_4_ = local_110._0_4_;
      SetField<int>(local_190,local_188,local_180,(int *)local_158);
      break;
    case 9:
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_190,&local_108);
      break;
    case 10:
      SetAllocatedMessage(local_190,local_188,local_110,local_180);
      break;
    default:
      internal::LogMessage::LogMessage
                ((LogMessage *)local_158,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar1 = internal::LogMessage::operator<<((LogMessage *)local_158,"unimplemented type: ");
      if (*(once_flag **)(pFVar2 + 0x18) != (once_flag *)0x0) {
        local_160 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
        local_e8 = pFVar2;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar2 + 0x18),(_func_void_FieldDescriptor_ptr **)&local_160,
                   &local_e8);
      }
      pLVar1 = internal::LogMessage::operator<<
                         (pLVar1,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)(byte)pFVar2[2] * 4));
      internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar1);
      internal::LogMessage::~LogMessage((LogMessage *)local_158);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32 oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}